

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O3

int read_observation_records(ingest_info *info)

{
  coda_type_array *pcVar1;
  coda_type_record *definition;
  undefined4 uVar2;
  char cVar3;
  byte value;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  coda_mem_record *pcVar8;
  coda_mem_data *pcVar9;
  coda_mem_special *field_type;
  coda_mem_array *pcVar10;
  byte value_00;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  long in_FS_OFFSET;
  undefined4 uVar16;
  undefined4 uVar17;
  int num_satellites;
  char str_1 [17];
  int number;
  double double_value;
  char epoch_string [28];
  char str [61];
  char line [1000];
  char line_1 [1000];
  int local_8ac;
  undefined2 local_8a8;
  undefined1 uStack_8a6;
  undefined4 uStack_8a5;
  undefined1 uStack_8a1;
  undefined4 uStack_8a0;
  undefined2 uStack_89c;
  char cStack_89a;
  char cStack_899;
  coda_mem_record *local_890;
  int local_888;
  uint8_t local_884 [4];
  long local_880;
  double local_878;
  double local_870;
  undefined8 local_868 [2];
  undefined8 uStack_855;
  undefined1 local_84d;
  undefined2 local_848;
  undefined1 local_846;
  undefined1 local_845;
  char local_808 [2];
  undefined8 local_806;
  undefined8 uStack_7f3;
  char local_7e9;
  undefined2 local_7e8;
  undefined1 local_7e6;
  char local_7df [967];
  byte local_418;
  undefined2 local_417;
  undefined4 local_415 [249];
  
  lVar7 = ftell((FILE *)info->f);
  info->offset = lVar7;
  info->linenumber = info->linenumber + 1;
  uVar4 = get_line(info->f,local_808);
  if (-1 < (int)uVar4) {
    while( true ) {
      if (uVar4 == 0) {
        return 0;
      }
      if (uVar4 < 0x23) break;
      if (local_808[0] != '>') {
        lVar7 = info->linenumber;
        lVar12 = info->offset;
        pcVar15 = "expected \'>\' as start of epoch record (line: %ld, byte offset: %ld)";
LAB_0011ec2a:
        coda_set_error(-0x16,pcVar15,lVar7,lVar12);
        return -1;
      }
      pcVar8 = coda_mem_record_new(info->epoch_record_definition,(coda_dynamic_type *)0x0);
      info->epoch_record = pcVar8;
      local_868[0] = local_806;
      uStack_855 = uStack_7f3;
      local_84d = 0;
      pcVar9 = coda_mem_string_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x160),
                                   (coda_dynamic_type *)0x0,info->product,(char *)local_868);
      field_type = coda_mem_time_new(*(coda_type_special **)
                                      (*(long *)(in_FS_OFFSET + -0x1c8) + 0x168),
                                     (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar9);
      coda_mem_record_add_field(info->epoch_record,"epoch",(coda_dynamic_type *)field_type,0);
      cVar3 = local_7e9;
      pcVar9 = coda_mem_char_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x170),
                                 (coda_dynamic_type *)0x0,info->product,local_7e9);
      coda_mem_record_add_field(info->epoch_record,"flag",(coda_dynamic_type *)pcVar9,0);
      local_848 = local_7e8;
      local_846 = local_7e6;
      local_845 = 0;
      iVar5 = __isoc99_sscanf(&local_848,"%3d",&local_8ac);
      if (iVar5 != 1) {
        lVar7 = info->linenumber;
        lVar12 = info->offset + 0x22;
        pcVar15 = 
        "invalid \'number of satellites\' entry in epoch record (line: %ld, byte offset: %ld)";
        goto LAB_0011ec2a;
      }
      if (uVar4 < 0x38) {
        local_878 = 0.0;
        uVar16 = 0;
        uVar17 = 0;
      }
      else {
        lVar7 = coda_ascii_parse_double(local_7df,0xf,&local_878,0);
        if (lVar7 < 0) {
          coda_add_error_message(" (line: %ld, byte offset: %ld)",info->linenumber,info->offset);
          return -1;
        }
        uVar16 = SUB84(local_878,0);
        uVar17 = (undefined4)((ulong)local_878 >> 0x20);
      }
      pcVar9 = coda_mem_double_new(*(coda_type_number **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x178),
                                   (coda_dynamic_type *)0x0,info->product,
                                   (double)CONCAT44(uVar17,uVar16));
      coda_mem_record_add_field
                (info->epoch_record,"receiver_clock_offset",(coda_dynamic_type *)pcVar9,0);
      pcVar1 = (info->gps).sat_obs_array_definition;
      if (pcVar1 != (coda_type_array *)0x0) {
        pcVar10 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
        (info->gps).sat_obs_array = pcVar10;
      }
      pcVar1 = (info->glonass).sat_obs_array_definition;
      if (pcVar1 != (coda_type_array *)0x0) {
        pcVar10 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
        (info->glonass).sat_obs_array = pcVar10;
      }
      pcVar1 = (info->galileo).sat_obs_array_definition;
      if (pcVar1 != (coda_type_array *)0x0) {
        pcVar10 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
        (info->galileo).sat_obs_array = pcVar10;
      }
      pcVar1 = (info->sbas).sat_obs_array_definition;
      if (pcVar1 != (coda_type_array *)0x0) {
        pcVar10 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
        (info->sbas).sat_obs_array = pcVar10;
      }
      if (cVar3 == '0') {
        if (0 < local_8ac) {
          iVar5 = 0;
          do {
            lVar7 = ftell((FILE *)info->f);
            info->offset = lVar7;
            info->linenumber = info->linenumber + 1;
            iVar6 = get_line(info->f,(char *)&local_418);
            if (iVar6 < 0) {
              return -1;
            }
            if (local_418 < 0x52) {
              if (local_418 == 0x45) {
                lVar7 = 0x78;
              }
              else {
                lVar7 = 0x18;
                if (local_418 != 0x47) {
LAB_0011ec15:
                  lVar7 = info->linenumber;
                  lVar12 = info->offset;
                  pcVar15 = 
                  "invalid satellite system for epoch record (line: %ld, byte offset: %ld)";
                  goto LAB_0011ec2a;
                }
              }
            }
            else if (local_418 == 0x53) {
              lVar7 = 0xa8;
            }
            else {
              if (local_418 != 0x52) goto LAB_0011ec15;
              lVar7 = 0x48;
            }
            if (*(long *)((long)&(info->gps).observable + lVar7) == 0) {
              coda_set_error(-0x16,
                             "satellite system \'%c\' was not defined in header for this observation record (line: %ld, byte offset: %ld)"
                             ,(ulong)local_418,info->linenumber,info->offset);
              return -1;
            }
            definition = *(coda_type_record **)((long)&info->header + lVar7);
            if (definition == (coda_type_record *)0x0) {
              __assert_fail("sat_info->sat_obs_definition != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                            ,0x96e,"int read_observation_record_for_satellite(ingest_info *)");
            }
            uVar13 = (ulong)iVar6;
            uVar14 = (long)*(int *)((long)&info->f + lVar7) << 4;
            uVar11 = uVar14 | 3;
            if ((int)uVar14 < iVar6) {
              if ((int)uVar11 <= iVar6) goto LAB_0011e773;
              memset(&local_418 + uVar13,0x20,(uVar14 & 0xffffffff | 3) - uVar13);
            }
            else {
              uVar11 = uVar14 & 0xffffffff | 3;
LAB_0011e773:
              if ((long)uVar13 < (long)uVar11) {
                lVar7 = info->linenumber;
                lVar12 = info->offset;
                pcVar15 = "epoch line length (%ld) too short (line: %ld, byte offset: %ld)";
                goto LAB_0011ebe9;
              }
            }
            pcVar8 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
            local_8a8 = local_417;
            uStack_8a6 = 0;
            iVar6 = __isoc99_sscanf(&local_8a8,"%2d",local_884);
            if (iVar6 != 1) {
              coda_dynamic_type_delete((coda_dynamic_type *)pcVar8);
              lVar7 = info->linenumber;
              lVar12 = info->offset + 1;
              pcVar15 = "invalid satellite number (line: %ld, byte offset: %ld)";
              goto LAB_0011ec2a;
            }
            local_888 = iVar5;
            pcVar9 = coda_mem_uint8_new(*(coda_type_number **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x180),
                                        (coda_dynamic_type *)0x0,info->product,local_884[0]);
            local_890 = pcVar8;
            coda_mem_record_add_field(pcVar8,"number",(coda_dynamic_type *)pcVar9,0);
            local_880 = lVar7;
            if (0 < *(int *)((long)&info->f + lVar7)) {
              uVar13 = 0;
              lVar7 = 0;
              do {
                uVar16 = *(undefined4 *)((long)local_415 + uVar13);
                uVar17 = *(undefined4 *)((long)local_415 + uVar13 + 4);
                uStack_8a0 = *(undefined4 *)((long)local_415 + uVar13 + 8);
                uVar2 = *(undefined4 *)((long)local_415 + uVar13 + 0xc);
                local_8a8 = (undefined2)uVar16;
                uStack_8a6 = (undefined1)((uint)uVar16 >> 0x10);
                uStack_8a5._1_3_ = (undefined3)uVar17;
                uStack_8a5 = CONCAT31(uStack_8a5._1_3_,(char)((uint)uVar16 >> 0x18));
                uStack_8a1 = (undefined1)((uint)uVar17 >> 0x18);
                uStack_89c = (undefined2)uVar2;
                cStack_89a = (char)((uint)uVar2 >> 0x10);
                cStack_899 = (char)((uint)uVar2 >> 0x18);
                value = cStack_89a - 0x30;
                if (9 < value) {
                  value = 0;
                }
                value_00 = cStack_899 - 0x30;
                if (9 < value_00) {
                  value_00 = 0;
                }
                cStack_89a = 0;
                iVar5 = __isoc99_sscanf(&local_8a8,"%lf",&local_870);
                if (iVar5 != 1) {
                  if (CONCAT17(cStack_89a,CONCAT25(uStack_89c,CONCAT41(uStack_8a0,uStack_8a1))) !=
                      0x20202020202020 ||
                      CONCAT17(uStack_8a1,CONCAT43(uStack_8a5,CONCAT12(uStack_8a6,local_8a8))) !=
                      0x2020202020202020) {
                    coda_dynamic_type_delete((coda_dynamic_type *)local_890);
                    coda_set_error(-0x16,"invalid observation value (line: %ld, byte offset: %ld)",
                                   info->linenumber,info->offset + (uVar13 & 0xffffffff) + 3);
                    return -1;
                  }
                  local_870 = 0.0;
                }
                pcVar8 = coda_mem_record_new(*(coda_type_record **)
                                              (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1a0),
                                             (coda_dynamic_type *)0x0);
                pcVar9 = coda_mem_double_new(*(coda_type_number **)
                                              (*(long *)(in_FS_OFFSET + -0x1c8) + 0x188),
                                             (coda_dynamic_type *)0x0,info->product,local_870);
                coda_mem_record_add_field(pcVar8,"observation",(coda_dynamic_type *)pcVar9,0);
                pcVar9 = coda_mem_uint8_new(*(coda_type_number **)
                                             (*(long *)(in_FS_OFFSET + -0x1c8) + 400),
                                            (coda_dynamic_type *)0x0,info->product,value);
                coda_mem_record_add_field(pcVar8,"lli",(coda_dynamic_type *)pcVar9,0);
                pcVar9 = coda_mem_uint8_new(*(coda_type_number **)
                                             (*(long *)(in_FS_OFFSET + -0x1c8) + 0x198),
                                            (coda_dynamic_type *)0x0,info->product,value_00);
                coda_mem_record_add_field(pcVar8,"signal_strength",(coda_dynamic_type *)pcVar9,0);
                lVar12 = local_880;
                coda_mem_record_add_field
                          (local_890,
                           *(char **)(*(long *)((long)&info->product + local_880) + lVar7 * 8),
                           (coda_dynamic_type *)pcVar8,0);
                lVar7 = lVar7 + 1;
                uVar13 = uVar13 + 0x10;
              } while (lVar7 < *(int *)((long)&info->f + lVar12));
            }
            coda_mem_array_add_element
                      (*(coda_mem_array **)((long)&(info->gps).observable + local_880),
                       (coda_dynamic_type *)local_890);
            iVar5 = local_888 + 1;
          } while (iVar5 < local_8ac);
        }
      }
      else if (0 < local_8ac) {
        iVar5 = 0;
        do {
          lVar7 = ftell((FILE *)info->f);
          info->offset = lVar7;
          info->linenumber = info->linenumber + 1;
          iVar6 = get_line(info->f,local_808);
          if (iVar6 < 0) {
            return -1;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_8ac);
      }
      pcVar10 = (info->gps).sat_obs_array;
      if (pcVar10 != (coda_mem_array *)0x0) {
        coda_mem_record_add_field(info->epoch_record,"gps",(coda_dynamic_type *)pcVar10,0);
        (info->gps).sat_obs_array = (coda_mem_array *)0x0;
      }
      pcVar10 = (info->glonass).sat_obs_array;
      if (pcVar10 != (coda_mem_array *)0x0) {
        coda_mem_record_add_field(info->epoch_record,"glonass",(coda_dynamic_type *)pcVar10,0);
        (info->glonass).sat_obs_array = (coda_mem_array *)0x0;
      }
      pcVar10 = (info->galileo).sat_obs_array;
      if (pcVar10 != (coda_mem_array *)0x0) {
        coda_mem_record_add_field(info->epoch_record,"galileo",(coda_dynamic_type *)pcVar10,0);
        (info->galileo).sat_obs_array = (coda_mem_array *)0x0;
      }
      pcVar10 = (info->sbas).sat_obs_array;
      if (pcVar10 != (coda_mem_array *)0x0) {
        coda_mem_record_add_field(info->epoch_record,"sbas",(coda_dynamic_type *)pcVar10,0);
        (info->sbas).sat_obs_array = (coda_mem_array *)0x0;
      }
      coda_mem_array_add_element(info->records,(coda_dynamic_type *)info->epoch_record);
      info->epoch_record = (coda_mem_record *)0x0;
      lVar7 = ftell((FILE *)info->f);
      info->offset = lVar7;
      info->linenumber = info->linenumber + 1;
      uVar4 = get_line(info->f,local_808);
      if ((int)uVar4 < 0) {
        return -1;
      }
    }
    uVar13 = (ulong)uVar4;
    lVar7 = info->linenumber;
    lVar12 = info->offset;
    pcVar15 = "record line length (%ld) too short (line: %ld, byte offset: %ld)";
LAB_0011ebe9:
    coda_set_error(-0x16,pcVar15,uVar13,lVar7,lVar12);
  }
  return -1;
}

Assistant:

static int read_observation_records(ingest_info *info)
{
    char line[MAX_LINE_LENGTH];
    long linelength;
    double double_value;
    char str[61];
    int i;

    info->offset = ftell(info->f);
    info->linenumber++;
    linelength = get_line(info->f, line);
    if (linelength < 0)
    {
        return -1;
    }
    while (linelength > 0)
    {
        coda_dynamic_type *base_type;
        coda_dynamic_type *value;
        coda_type *rtype;
        char epoch_string[28];
        char epoch_flag;
        int num_satellites;

        if (linelength < 35)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "record line length (%ld) too short (line: %ld, byte offset: %ld)",
                           linelength, info->linenumber, info->offset);
            return -1;
        }
        if (line[0] != '>')
        {
            coda_set_error(CODA_ERROR_FILE_READ, "expected '>' as start of epoch record (line: %ld, byte offset: %ld)",
                           info->linenumber, info->offset);
            return -1;
        }

        info->epoch_record = coda_mem_record_new(info->epoch_record_definition, NULL);

        memcpy(epoch_string, &line[2], 27);
        epoch_string[27] = '\0';
        rtype = rinex_type[rinex_epoch_string];
        base_type = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)rtype, NULL, info->product,
                                                             epoch_string);
        rtype = rinex_type[rinex_obs_epoch];
        value = (coda_dynamic_type *)coda_mem_time_new((coda_type_special *)rtype, NULL, base_type);
        coda_mem_record_add_field(info->epoch_record, "epoch", value, 0);

        epoch_flag = line[31];
        rtype = rinex_type[rinex_obs_epoch_flag];
        value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rtype, NULL, info->product, epoch_flag);
        coda_mem_record_add_field(info->epoch_record, "flag", value, 0);

        memcpy(str, &line[32], 3);
        str[3] = '\0';
        if (sscanf(str, "%3d", &num_satellites) != 1)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "invalid 'number of satellites' entry in epoch record "
                           "(line: %ld, byte offset: %ld)", info->linenumber, info->offset + 34);
            return -1;
        }

        if (linelength >= 56)
        {
            if (coda_ascii_parse_double(&line[41], 15, &double_value, 0) < 0)
            {
                coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset);
                return -1;
            }
        }
        else
        {
            double_value = 0;
        }
        rtype = rinex_type[rinex_receiver_clock_offset];
        value = (coda_dynamic_type *)coda_mem_double_new((coda_type_number *)rtype, NULL, info->product, double_value);
        coda_mem_record_add_field(info->epoch_record, "receiver_clock_offset", value, 0);

        if (info->gps.sat_obs_array_definition != NULL)
        {
            info->gps.sat_obs_array = coda_mem_array_new(info->gps.sat_obs_array_definition, NULL);
        }
        if (info->glonass.sat_obs_array_definition != NULL)
        {
            info->glonass.sat_obs_array = coda_mem_array_new(info->glonass.sat_obs_array_definition, NULL);
        }
        if (info->galileo.sat_obs_array_definition != NULL)
        {
            info->galileo.sat_obs_array = coda_mem_array_new(info->galileo.sat_obs_array_definition, NULL);
        }
        if (info->sbas.sat_obs_array_definition != NULL)
        {
            info->sbas.sat_obs_array = coda_mem_array_new(info->sbas.sat_obs_array_definition, NULL);
        }

        /* check epoch flag */
        if (epoch_flag != '0')
        {
            /* we skip the remaining part of this record if epoch flag != 0 */
            for (i = 0; i < num_satellites; i++)
            {
                info->offset = ftell(info->f);
                info->linenumber++;
                linelength = get_line(info->f, line);
                if (linelength < 0)
                {
                    return -1;
                }
            }
        }
        else
        {
            for (i = 0; i < num_satellites; i++)
            {
                if (read_observation_record_for_satellite(info) != 0)
                {
                    return -1;
                }
            }
        }

        if (info->gps.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "gps", (coda_dynamic_type *)info->gps.sat_obs_array, 0);
            info->gps.sat_obs_array = NULL;
        }
        if (info->glonass.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "glonass", (coda_dynamic_type *)info->glonass.sat_obs_array,
                                      0);
            info->glonass.sat_obs_array = NULL;
        }
        if (info->galileo.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "galileo", (coda_dynamic_type *)info->galileo.sat_obs_array,
                                      0);
            info->galileo.sat_obs_array = NULL;
        }
        if (info->sbas.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "sbas", (coda_dynamic_type *)info->sbas.sat_obs_array, 0);
            info->sbas.sat_obs_array = NULL;
        }
        coda_mem_array_add_element(info->records, (coda_dynamic_type *)info->epoch_record);
        info->epoch_record = NULL;

        info->offset = ftell(info->f);
        info->linenumber++;
        linelength = get_line(info->f, line);
        if (linelength < 0)
        {
            return -1;
        }
    }

    return 0;
}